

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

void proto3_unittest::NestedTestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *arena;
  NestedTestAllTypes *_this;
  NestedTestAllTypes *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (NestedTestAllTypes *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3_unittest::NestedTestAllTypes_const*,proto3_unittest::NestedTestAllTypes*>
                          ((NestedTestAllTypes **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        pMVar2 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.child_ != nullptr";
          line = 0x127b;
          goto LAB_00a6c660;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 8);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<proto3_unittest::NestedTestAllTypes>
                             (arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 8) = pvVar4;
        }
        else {
          MergeImpl(pMVar3,pMVar2);
        }
      }
      if ((uVar1 & 2) != 0) {
        pMVar2 = (MessageLite *)from_msg[2]._vptr_MessageLite;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.payload_ != nullptr";
          line = 0x1283;
          goto LAB_00a6c660;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x10);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes>
                             (arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 0x10) = pvVar4;
        }
        else {
          proto3_unittest::TestAllTypes::MergeImpl(pMVar3,pMVar2);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x1274;
LAB_00a6c660:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void NestedTestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<NestedTestAllTypes*>(&to_msg);
  auto& from = static_cast<const NestedTestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.NestedTestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.payload_ != nullptr);
      if (_this->_impl_.payload_ == nullptr) {
        _this->_impl_.payload_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.payload_);
      } else {
        _this->_impl_.payload_->MergeFrom(*from._impl_.payload_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}